

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

void __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Face>::~Pool
          (Pool<btConvexHullInternal::Face> *this)

{
  PoolArray<btConvexHullInternal::Face> *this_00;
  
  while (this_00 = this->arrays, this_00 != (PoolArray<btConvexHullInternal::Face> *)0x0) {
    this->arrays = this_00->next;
    PoolArray<btConvexHullInternal::Face>::~PoolArray(this_00);
    btAlignedFreeInternal(this_00);
  }
  return;
}

Assistant:

~Pool()
				{
					while (arrays)
					{
						PoolArray<T>* p = arrays;
						arrays = p->next;
						p->~PoolArray<T>();
						btAlignedFree(p);
					}
				}